

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::handleBreakValue(InfoCollector *this,Expression *curr)

{
  Expression *curr_local;
  InfoCollector *this_local;
  
  BranchUtils::
  operateOnScopeNameUsesAndSentValues<wasm::(anonymous_namespace)::InfoCollector::handleBreakValue(wasm::Expression*)::_lambda(wasm::Name,wasm::Expression*)_1_>
            (curr,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void handleBreakValue(Expression* curr) {
    BranchUtils::operateOnScopeNameUsesAndSentValues(
      curr, [&](Name target, Expression* value) {
        if (value && isRelevant(value->type)) {
          for (Index i = 0; i < value->type.size(); i++) {
            // Breaks send the contents of the break value to the branch target
            // that the break goes to.
            info.links.push_back({ExpressionLocation{value, i},
                                  getBreakTargetLocation(target, i)});
          }
        }
      });
  }